

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_1b0fcc::Db::parseEncoding(Db *this)

{
  char *pcVar1;
  ForwardTemplateReference **ppFVar2;
  Node **ppNVar3;
  byte *pbVar4;
  Node **ppNVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  Node *pNVar9;
  Node *pNVar10;
  char *pcVar11;
  SpecialName *pSVar12;
  Node *pNVar13;
  _func_int **pp_Var14;
  char cVar15;
  byte bVar16;
  ulong uVar17;
  ulong uVar18;
  ForwardTemplateReference *pFVar19;
  ulong uVar20;
  ulong uVar21;
  StringView SVar22;
  Node NVar23;
  NodeArray NVar24;
  Node *Arg;
  NameState NameInfo;
  Node *local_60;
  undefined8 local_58;
  FunctionRefQual local_50;
  ulong local_48;
  Node *local_40;
  _func_int **local_38;
  
  pcVar11 = this->First;
  pcVar1 = this->Last;
  if (pcVar1 == pcVar11) {
LAB_0015554b:
    local_58 = (Node *)(((ulong)local_58 >> 0x10 & 0xffff) << 0x10);
    local_50 = FrefQualNone;
    local_48 = (long)(this->ForwardTemplateRefs).Last - (long)(this->ForwardTemplateRefs).First >> 3
    ;
    pNVar9 = parseName(this,(NameState *)&local_58);
    if (pNVar9 != (Node *)0x0) {
      ppFVar2 = (this->ForwardTemplateRefs).First;
      uVar17 = (long)(this->ForwardTemplateRefs).Last - (long)ppFVar2 >> 3;
      bVar6 = local_48 < uVar17;
      if (bVar6) {
        ppNVar3 = (this->TemplateParams).First;
        uVar18 = (long)(this->TemplateParams).Last - (long)ppNVar3 >> 3;
        pFVar19 = ppFVar2[local_48];
        uVar21 = pFVar19->Index;
        if (uVar18 <= uVar21) goto LAB_001557f4;
        uVar20 = local_48;
        do {
          pFVar19->Ref = ppNVar3[uVar21];
          if (uVar17 - 1 == uVar20) {
            bVar6 = false;
            goto LAB_001557db;
          }
          pFVar19 = ppFVar2[uVar20 + 1];
          uVar21 = pFVar19->Index;
          uVar20 = uVar20 + 1;
        } while (uVar21 < uVar18);
        bVar6 = uVar20 < uVar17;
      }
      else {
LAB_001557db:
        if (uVar17 < local_48) {
          __assert_fail("Index <= size() && \"dropBack() can\'t expand!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                        ,0x780,
                        "void (anonymous namespace)::PODSmallVector<(anonymous namespace)::ForwardTemplateReference *, 4>::dropBack(size_t) [T = (anonymous namespace)::ForwardTemplateReference *, N = 4]"
                       );
        }
        (this->ForwardTemplateRefs).Last = ppFVar2 + local_48;
      }
      if (!bVar6) {
        pbVar4 = (byte *)this->First;
        if ((byte *)this->Last == pbVar4) {
          return pNVar9;
        }
        if ((*pbVar4 - 0x2e < 0x32) &&
           ((0x2000000800001U >> ((ulong)(*pbVar4 - 0x2e) & 0x3f) & 1) != 0)) {
          return pNVar9;
        }
        if (((ulong)((long)this->Last - (long)pbVar4) < 0xd) ||
           (*(long *)(pbVar4 + 5) != 0x4966695f656c6261 || *(long *)pbVar4 != 0x6c62616e65396155)) {
          pp_Var14 = (_func_int **)0x0;
        }
        else {
          this->First = (char *)(pbVar4 + 0xd);
          ppNVar3 = (this->Names).Last;
          ppNVar5 = (this->Names).First;
          while( true ) {
            pcVar11 = this->First;
            if ((pcVar11 == this->Last) || (*pcVar11 != 'E')) {
              bVar6 = false;
            }
            else {
              this->First = pcVar11 + 1;
              bVar6 = true;
            }
            if (bVar6) {
              NVar24 = popTrailingNodeArray(this,(long)ppNVar3 - (long)ppNVar5 >> 3);
              pp_Var14 = (_func_int **)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
              *(undefined4 *)(pp_Var14 + 1) = 0x1010109;
              *pp_Var14 = (_func_int *)&PTR_hasRHSComponentSlow_0018d7a8;
              *(NodeArray *)(pp_Var14 + 2) = NVar24;
              goto LAB_00155d97;
            }
            local_60 = parseTemplateArg(this);
            if (local_60 == (Node *)0x0) break;
            PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_60);
          }
          pp_Var14 = (_func_int **)0x0;
LAB_00155d97:
          if (!bVar6) goto LAB_001557f4;
        }
        if ((local_58._0_1_ != false) || (local_58._1_1_ != true)) {
          pNVar10 = (Node *)0x0;
LAB_00155b58:
          pcVar11 = this->First;
          if ((pcVar11 == this->Last) || (*pcVar11 != 'v')) {
            ppNVar3 = (this->Names).Last;
            ppNVar5 = (this->Names).First;
            local_40 = pNVar10;
            local_38 = pp_Var14;
            do {
              local_60 = parseType(this);
              if (local_60 == (Node *)0x0) goto LAB_001557f4;
              PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_60)
              ;
            } while ((this->Last != this->First) &&
                    ((uVar8 = (byte)*this->First - 0x2e, 0x31 < uVar8 ||
                     ((0x2000000800001U >> ((ulong)uVar8 & 0x3f) & 1) == 0))));
            NVar23 = (Node)popTrailingNodeArray(this,(long)ppNVar3 - (long)ppNVar5 >> 3);
            pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x40);
            pNVar13->K = KFunctionEncoding;
            pNVar13->RHSComponentCache = Yes;
            pNVar13->ArrayCache = No;
            pNVar13->FunctionCache = Yes;
            pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018d800;
            pNVar13[1]._vptr_Node = (_func_int **)local_40;
            *(Node **)&pNVar13[1].K = pNVar9;
            pNVar13[2] = NVar23;
            pNVar13[3]._vptr_Node = local_38;
          }
          else {
            this->First = pcVar11 + 1;
            pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x40);
            pNVar13->K = KFunctionEncoding;
            pNVar13->RHSComponentCache = Yes;
            pNVar13->ArrayCache = No;
            pNVar13->FunctionCache = Yes;
            pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018d800;
            pNVar13[1]._vptr_Node = (_func_int **)pNVar10;
            *(Node **)&pNVar13[1].K = pNVar9;
            pNVar13[2]._vptr_Node = (_func_int **)0x0;
            pNVar13[2].K = KNodeArrayNode;
            pNVar13[2].RHSComponentCache = Yes;
            pNVar13[2].ArrayCache = Yes;
            pNVar13[2].FunctionCache = Yes;
            *(undefined4 *)&pNVar13[2].field_0xc = 0;
            pNVar13[3]._vptr_Node = pp_Var14;
          }
          pNVar13[3].K = (char)local_58._4_4_;
          pNVar13[3].RHSComponentCache = (char)(local_58._4_4_ >> 8);
          pNVar13[3].ArrayCache = (char)(local_58._4_4_ >> 0x10);
          pNVar13[3].FunctionCache = (char)(local_58._4_4_ >> 0x18);
          pNVar13[3].field_0xc = local_50;
          return pNVar13;
        }
        pNVar10 = parseType(this);
        if (pNVar10 != (Node *)0x0) goto LAB_00155b58;
      }
    }
LAB_001557f4:
    pNVar10 = (Node *)0x0;
  }
  else {
    if (*pcVar11 == 'G') {
      if ((ulong)((long)pcVar1 - (long)pcVar11) < 2) {
        cVar15 = '\0';
      }
      else {
        cVar15 = pcVar11[1];
      }
      if (cVar15 == 'R') {
        this->First = pcVar11 + 2;
        pNVar9 = parseName(this,(NameState *)0x0);
        if (pNVar9 == (Node *)0x0) {
          return (Node *)0x0;
        }
        bVar6 = parseSeqId(this,&local_58);
        pcVar11 = this->First;
        if ((pcVar11 == this->Last) || (*pcVar11 != '_')) {
          bVar16 = 0;
        }
        else {
          this->First = pcVar11 + 1;
          bVar16 = 1;
        }
        if ((bVar6 | bVar16) != 1) goto LAB_001557f4;
        pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar10->K = KSpecialName;
        pNVar10->RHSComponentCache = No;
        pNVar10->ArrayCache = No;
        pNVar10->FunctionCache = No;
        pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c620;
        pNVar10[1]._vptr_Node = (_func_int **)"reference temporary for ";
        pcVar11 = "";
      }
      else {
        if (cVar15 != 'V') goto LAB_001557f4;
        this->First = pcVar11 + 2;
        pNVar9 = parseName(this,(NameState *)0x0);
        if (pNVar9 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar10->K = KSpecialName;
        pNVar10->RHSComponentCache = No;
        pNVar10->ArrayCache = No;
        pNVar10->FunctionCache = No;
        pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c620;
        pNVar10[1]._vptr_Node = (_func_int **)"guard variable for ";
        pcVar11 = "";
      }
      goto LAB_00155d49;
    }
    if (*pcVar11 != 'T') goto LAB_0015554b;
    if ((ulong)((long)pcVar1 - (long)pcVar11) < 2) {
      bVar16 = 0;
    }
    else {
      bVar16 = pcVar11[1];
    }
    if (bVar16 < 0x53) {
      if (bVar16 == 0x43) {
        this->First = pcVar11 + 2;
        pNVar9 = parseType(this);
        if ((((pNVar9 != (Node *)0x0) &&
             (SVar22 = parseNumber(this,true), SVar22.First != SVar22.Last)) &&
            (pcVar11 = this->First, pcVar11 != this->Last)) && (*pcVar11 == '_')) {
          this->First = pcVar11 + 1;
          pNVar10 = parseType(this);
          if (pNVar10 != (Node *)0x0) {
            pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
            pNVar13->K = KCtorVtableSpecialName;
            pNVar13->RHSComponentCache = No;
            pNVar13->ArrayCache = No;
            pNVar13->FunctionCache = No;
            pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c6d0;
            pNVar13[1]._vptr_Node = (_func_int **)pNVar10;
            *(Node **)&pNVar13[1].K = pNVar9;
            return pNVar13;
          }
        }
        goto LAB_001557f4;
      }
      if (bVar16 == 0x48) {
        this->First = pcVar11 + 2;
        pNVar9 = parseName(this,(NameState *)0x0);
        if (pNVar9 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar10->K = KSpecialName;
        pNVar10->RHSComponentCache = No;
        pNVar10->ArrayCache = No;
        pNVar10->FunctionCache = No;
        pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c620;
        pNVar10[1]._vptr_Node = (_func_int **)"thread-local initialization routine for ";
        pcVar11 = "";
      }
      else {
        if (bVar16 != 0x49) goto switchD_00155646_caseD_55;
        this->First = pcVar11 + 2;
        pNVar9 = parseType(this);
        if (pNVar9 == (Node *)0x0) goto LAB_001557f4;
        pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar10->K = KSpecialName;
        pNVar10->RHSComponentCache = No;
        pNVar10->ArrayCache = No;
        pNVar10->FunctionCache = No;
        pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c620;
        pNVar10[1]._vptr_Node = (_func_int **)"typeinfo for ";
        pcVar11 = "";
      }
    }
    else {
      switch(bVar16) {
      case 0x53:
        this->First = pcVar11 + 2;
        pNVar9 = parseType(this);
        if (pNVar9 == (Node *)0x0) goto LAB_001557f4;
        pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar10->K = KSpecialName;
        pNVar10->RHSComponentCache = No;
        pNVar10->ArrayCache = No;
        pNVar10->FunctionCache = No;
        pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c620;
        pNVar10[1]._vptr_Node = (_func_int **)"typeinfo name for ";
        pcVar11 = "";
        break;
      case 0x54:
        this->First = pcVar11 + 2;
        pNVar9 = parseType(this);
        if (pNVar9 == (Node *)0x0) goto LAB_001557f4;
        pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar10->K = KSpecialName;
        pNVar10->RHSComponentCache = No;
        pNVar10->ArrayCache = No;
        pNVar10->FunctionCache = No;
        pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c620;
        pNVar10[1]._vptr_Node = (_func_int **)"VTT for ";
        pcVar11 = "";
        break;
      case 0x55:
switchD_00155646_caseD_55:
        pcVar11 = pcVar11 + 1;
        this->First = pcVar11;
        if (pcVar1 == pcVar11) {
          bVar6 = false;
        }
        else {
          bVar6 = *pcVar11 == 'v';
        }
        bVar7 = parseCallOffset(this);
        if ((bVar7) || (pNVar9 = parseEncoding(this), pNVar9 == (Node *)0x0)) goto LAB_001557f4;
        pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar10->K = KSpecialName;
        pNVar10->RHSComponentCache = No;
        pNVar10->ArrayCache = No;
        pNVar10->FunctionCache = No;
        pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c620;
        if (bVar6) {
          pNVar10[1]._vptr_Node = (_func_int **)0x1705cb;
          pcVar11 = "";
        }
        else {
          pNVar10[1]._vptr_Node = (_func_int **)"non-virtual thunk to ";
          pcVar11 = "";
        }
        break;
      case 0x56:
        this->First = pcVar11 + 2;
        pNVar9 = parseType(this);
        if (pNVar9 == (Node *)0x0) goto LAB_001557f4;
        pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar10->K = KSpecialName;
        pNVar10->RHSComponentCache = No;
        pNVar10->ArrayCache = No;
        pNVar10->FunctionCache = No;
        pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c620;
        pNVar10[1]._vptr_Node = (_func_int **)0x170617;
        pcVar11 = "";
        break;
      case 0x57:
        this->First = pcVar11 + 2;
        local_58 = parseName(this,(NameState *)0x0);
        if (local_58 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pSVar12 = (anonymous_namespace)::Db::
                  make<(anonymous_namespace)::SpecialName,char_const(&)[34],(anonymous_namespace)::Node*&>
                            ((Db *)this,(char (*) [34])"thread-local wrapper routine for ",
                             (Node **)&local_58);
        return &pSVar12->super_Node;
      default:
        if (bVar16 != 99) goto switchD_00155646_caseD_55;
        this->First = pcVar11 + 2;
        bVar6 = parseCallOffset(this);
        if (((bVar6) || (bVar6 = parseCallOffset(this), bVar6)) ||
           (pNVar9 = parseEncoding(this), pNVar9 == (Node *)0x0)) goto LAB_001557f4;
        pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar10->K = KSpecialName;
        pNVar10->RHSComponentCache = No;
        pNVar10->ArrayCache = No;
        pNVar10->FunctionCache = No;
        pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c620;
        pNVar10[1]._vptr_Node = (_func_int **)"covariant return thunk to ";
        pcVar11 = "";
      }
    }
LAB_00155d49:
    *(char **)&pNVar10[1].K = pcVar11;
    pNVar10[2]._vptr_Node = (_func_int **)pNVar9;
  }
  return pNVar10;
}

Assistant:

Node *Db::parseEncoding() {
  if (look() == 'G' || look() == 'T')
    return parseSpecialName();

  auto IsEndOfEncoding = [&] {
    // The set of chars that can potentially follow an <encoding> (none of which
    // can start a <type>). Enumerating these allows us to avoid speculative
    // parsing.
    return numLeft() == 0 || look() == 'E' || look() == '.' || look() == '_';
  };

  NameState NameInfo(this);
  Node *Name = parseName(&NameInfo);
  if (Name == nullptr)
    return nullptr;

  if (resolveForwardTemplateRefs(NameInfo))
    return nullptr;

  if (IsEndOfEncoding())
    return Name;

  Node *Attrs = nullptr;
  if (consumeIf("Ua9enable_ifI")) {
    size_t BeforeArgs = Names.size();
    while (!consumeIf('E')) {
      Node *Arg = parseTemplateArg();
      if (Arg == nullptr)
        return nullptr;
      Names.push_back(Arg);
    }
    Attrs = make<EnableIfAttr>(popTrailingNodeArray(BeforeArgs));
  }

  Node *ReturnType = nullptr;
  if (!NameInfo.CtorDtorConversion && NameInfo.EndsWithTemplateArgs) {
    ReturnType = parseType();
    if (ReturnType == nullptr)
      return nullptr;
  }

  if (consumeIf('v'))
    return make<FunctionEncoding>(ReturnType, Name, NodeArray(),
                                  Attrs, NameInfo.CVQualifiers,
                                  NameInfo.ReferenceQualifier);

  size_t ParamsBegin = Names.size();
  do {
    Node *Ty = parseType();
    if (Ty == nullptr)
      return nullptr;
    Names.push_back(Ty);
  } while (!IsEndOfEncoding());

  return make<FunctionEncoding>(ReturnType, Name,
                                popTrailingNodeArray(ParamsBegin),
                                Attrs, NameInfo.CVQualifiers,
                                NameInfo.ReferenceQualifier);
}